

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::flipnm_post
          (tetgenmesh *this,triface *abtets,int n,int nn,int abedgepivot,flipconstraints *fc)

{
  triface *abtets_00;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  triface *local_a0;
  uint local_98;
  uint local_94;
  int j;
  int i;
  int n1;
  int t;
  int edgepivot;
  int fliptype;
  triface *tmpabtets;
  triface flipface;
  triface fliptets [3];
  flipconstraints *fc_local;
  uint local_20;
  int abedgepivot_local;
  int nn_local;
  int n_local;
  triface *abtets_local;
  tetgenmesh *this_local;
  
  local_a0 = (triface *)&flipface.ver;
  do {
    triface::triface(local_a0);
    local_a0 = local_a0 + 1;
  } while (local_a0 != (triface *)&fliptets[2].ver);
  triface::triface((triface *)&tmpabtets);
  local_20 = nn;
  if (nn == 2) {
    if ((fc->unflip != 0) && (flip23(this,abtets,1,fc), fc->collectnewtets != 0)) {
      if (abedgepivot == 0) {
        this->cavetetlist->objects = this->cavetetlist->objects + -2;
      }
      else {
        this->cavetetlist->objects = this->cavetetlist->objects + -1;
      }
    }
    local_20 = 3;
  }
  for (local_94 = local_20; (int)local_94 < n; local_94 = local_94 + 1) {
    uVar2 = abtets[(int)local_94].ver >> 4 & 3;
    if (uVar2 == 1) {
      uVar2 = abtets[(int)local_94].ver >> 6;
      if (fc->unflip != 0) {
        if (2 < this->b->verbose) {
          printf("      Recover a 2-to-3 flip at f[%d].\n",(ulong)uVar2);
        }
        triface::operator=((triface *)&flipface.ver,
                           abtets + (int)((uVar2 - 1) + local_94) % (int)local_94);
        eprevself(this,(triface *)&flipface.ver);
        esymself(this,(triface *)&flipface.ver);
        enextself(this,(triface *)&flipface.ver);
        fnext(this,(triface *)&flipface.ver,(triface *)&fliptets[0].ver);
        fnext(this,(triface *)&fliptets[0].ver,(triface *)&fliptets[1].ver);
        flip32(this,(triface *)&flipface.ver,1,fc);
        uVar3 = local_94;
        while (local_98 = uVar3 - 1, (int)uVar2 <= (int)local_98) {
          triface::operator=(abtets + (int)uVar3,abtets + (int)local_98);
          uVar3 = local_98;
        }
        esym(this,(triface *)&fliptets[0].ver,abtets + (int)(uVar2 + local_94) % (int)(local_94 + 1)
            );
        triface::operator=(abtets + (int)uVar2,(triface *)&flipface.ver);
        if (fc->collectnewtets != 0) {
          this->cavetetlist->objects = this->cavetetlist->objects + -2;
        }
      }
    }
    else if (uVar2 == 2) {
      abtets_00 = (triface *)abtets[(int)local_94].tet;
      uVar2 = abtets[(int)local_94].ver >> 0x13 & 0x1fff;
      uVar3 = abtets[(int)local_94].ver & 3;
      uVar4 = abtets[(int)local_94].ver >> 6 & 0x1fff;
      if (fc->unflip == 0) {
        flipnm_post(this,abtets_00,uVar2,2,uVar3,fc);
      }
      else {
        if (2 < this->b->verbose) {
          printf("      Recover a %d-to-m flip at e[%d] of f[%d].\n",(ulong)uVar2,(ulong)uVar3,
                 (ulong)uVar4);
        }
        if (uVar3 == 1) {
          triface::operator=(abtets_00,abtets + (int)((uVar4 - 1) + local_94) % (int)local_94);
          eprevself(this,abtets_00);
          esymself(this,abtets_00);
          eprevself(this,abtets_00);
          fsym(this,abtets_00,abtets_00 + 1);
        }
        else {
          triface::operator=(abtets_00 + 1,abtets + (int)((uVar4 - 1) + local_94) % (int)local_94);
          enextself(this,abtets_00 + 1);
          esymself(this,abtets_00 + 1);
          enextself(this,abtets_00 + 1);
          fsym(this,abtets_00 + 1,abtets_00);
        }
        flipnm_post(this,abtets_00,uVar2,2,uVar3,fc);
        uVar1 = local_94;
        while (local_98 = uVar1 - 1, (int)uVar4 <= (int)local_98) {
          triface::operator=(abtets + (int)uVar1,abtets + (int)local_98);
          uVar1 = local_98;
        }
        if (uVar3 == 1) {
          triface::operator=((triface *)&flipface.ver,abtets_00 + 1);
          enextself(this,(triface *)&flipface.ver);
          esymself(this,(triface *)&flipface.ver);
          triface::operator=((triface *)&fliptets[0].ver,abtets_00);
          esymself(this,(triface *)&fliptets[0].ver);
          eprevself(this,(triface *)&fliptets[0].ver);
        }
        else {
          triface::operator=((triface *)&flipface.ver,abtets_00 + 1);
          eprevself(this,(triface *)&flipface.ver);
          esymself(this,(triface *)&flipface.ver);
          triface::operator=((triface *)&fliptets[0].ver,abtets_00);
          esymself(this,(triface *)&fliptets[0].ver);
          enextself(this,(triface *)&fliptets[0].ver);
        }
        triface::operator=(abtets + (int)(uVar4 + local_94) % (int)(local_94 + 1),
                           (triface *)&flipface.ver);
        triface::operator=(abtets + (int)uVar4,(triface *)&fliptets[0].ver);
      }
      if (2 < this->b->verbose) {
        printf("      Release %d spaces at f[%d].\n",(ulong)uVar2,(ulong)local_94);
      }
      if (abtets_00 != (triface *)0x0) {
        operator_delete__(abtets_00);
      }
    }
  }
  return 1;
}

Assistant:

int tetgenmesh::flipnm_post(triface* abtets, int n, int nn, int abedgepivot,
                            flipconstraints* fc)
{
  triface fliptets[3], flipface;
  triface *tmpabtets;
  int fliptype;
  int edgepivot;
  int t, n1;
  int i, j;


  if (nn == 2) {
    // The edge [a,b] has been flipped.
    // 'abtets[0]' is [c,d,e,b] or [#,#,#,b].
    // 'abtets[1]' is [d,c,e,a] or [#,#,#,a].
    if (fc->unflip) {
      // Do a 2-to-3 flip to recover the edge [a,b]. There may be hull tets.
      flip23(abtets, 1, fc);
      if (fc->collectnewtets) {
        // Pop up new (flipped) tets from the stack.
        if (abedgepivot == 0) {
          // Two new tets were collected.
          cavetetlist->objects -= 2;
        } else {
          // Only one of the two new tets was collected.
          cavetetlist->objects -= 1;
        }
      }
    } 
    // The initial size of Star(ab) is 3.
    nn++;
  } 

  // Walk through the performed flips.
  for (i = nn; i < n; i++) {
    // At the beginning of each step 'i', the size of the Star([a,b]) is 'i'.
    // At the end of this step, the size of the Star([a,b]) is 'i+1'.
    // The sizes of the Link([a,b]) are the same.
    fliptype = ((abtets[i].ver >> 4) & 3); // 0, 1, or 2.
    if (fliptype == 1) {
      // It was a 2-to-3 flip: [a,b,c]->[e,d].
      t = (abtets[i].ver >> 6);
      if (fc->unflip) {
        if (b->verbose > 2) {
          printf("      Recover a 2-to-3 flip at f[%d].\n", t);
        }
        // 'abtets[(t-1)%i]' is the tet [a,b,e,d] in current Star(ab), i.e.,
        //   it is created by a 2-to-3 flip [a,b,c] => [e,d].
        fliptets[0] = abtets[((t - 1) + i) % i]; // [a,b,e,d]
        eprevself(fliptets[0]);
        esymself(fliptets[0]);
        enextself(fliptets[0]); // [e,d,a,b]
        fnext(fliptets[0], fliptets[1]); // [e,d,b,c]
        fnext(fliptets[1], fliptets[2]); // [e,d,c,a]
        // Do a 3-to-2 flip: [e,d] => [a,b,c].
        // NOTE: hull tets may be invloved.
        flip32(fliptets, 1, fc);
        // Expand the array 'abtets', maintain the original order.
        // The new array length is (i+1).
        for (j = i - 1; j >= t; j--) {
          abtets[j + 1] = abtets[j];  // Downshift
        }
        // The tet abtets[(t-1)%i] is deleted. Insert the two new tets 
        //   'fliptets[0]' [a,b,c,d] and 'fliptets[1]' [b,a,c,e] into
        //   the (t-1)-th and t-th entries, respectively.
        esym(fliptets[1], abtets[((t-1) + (i+1)) % (i+1)]); // [a,b,e,c]
        abtets[t] = fliptets[0]; // [a,b,c,d]
        if (fc->collectnewtets) {
          // Pop up two (flipped) tets from the stack.
          cavetetlist->objects -= 2;
        }
      } 
    } else if (fliptype == 2) {
      tmpabtets = (triface *) (abtets[i].tet);
      n1 = ((abtets[i].ver >> 19) & 8191); // \sum_{i=0^12}{2^i} = 8191
      edgepivot = (abtets[i].ver & 3); 
      t = ((abtets[i].ver >> 6) & 8191);
      if (fc->unflip) {        
        if (b->verbose > 2) {
          printf("      Recover a %d-to-m flip at e[%d] of f[%d].\n", n1, 
                 edgepivot, t);
        }
        // Recover the flipped edge ([c,b] or [a,c]).
        // abtets[(t - 1 + i) % i] is [a,b,e,d], i.e., the tet created by
        //   the flipping of edge [c,b] or [a,c]. It must still exist in
        //   Star(ab). Use it to recover the flipped edge.
        if (edgepivot == 1) { 
          // The flip edge is [c,b].
          tmpabtets[0] = abtets[(t - 1 + i) % i]; // [a,b,e,d]
          eprevself(tmpabtets[0]);
          esymself(tmpabtets[0]);
          eprevself(tmpabtets[0]); // [d,a,e,b]
          fsym(tmpabtets[0], tmpabtets[1]); // [a,d,e,c]
        } else {
          // The flip edge is [a,c].
          tmpabtets[1] = abtets[(t - 1 + i) % i]; // [a,b,e,d]
          enextself(tmpabtets[1]);
          esymself(tmpabtets[1]);
          enextself(tmpabtets[1]); // [b,d,e,a]
          fsym(tmpabtets[1], tmpabtets[0]); // [d,b,e,c]
        } // if (edgepivot == 2)

        // Do a n1-to-m1 flip to recover the flipped edge ([c,b] or [a,c]).
        flipnm_post(tmpabtets, n1, 2, edgepivot, fc);

        // Insert the two recovered tets into the original Star(ab).
        for (j = i - 1; j >= t; j--) {
          abtets[j + 1] = abtets[j];  // Downshift
        }
        if (edgepivot == 1) {
          // tmpabtets[0] is [c,b,d,a] ==> contains [a,b]
          // tmpabtets[1] is [c,b,a,e] ==> contains [a,b]
          // tmpabtets[2] is [c,b,e,d]
          fliptets[0] = tmpabtets[1];
          enextself(fliptets[0]);
          esymself(fliptets[0]); // [a,b,e,c]
          fliptets[1] = tmpabtets[0];
          esymself(fliptets[1]);
          eprevself(fliptets[1]); // [a,b,c,d]
        } else {
          // tmpabtets[0] is [a,c,d,b] ==> contains [a,b]
          // tmpabtets[1] is [a,c,b,e] ==> contains [a,b]
          // tmpabtets[2] is [a,c,e,d]
          fliptets[0] = tmpabtets[1];
          eprevself(fliptets[0]);
          esymself(fliptets[0]); // [a,b,e,c]
          fliptets[1] = tmpabtets[0];
          esymself(fliptets[1]);
          enextself(fliptets[1]); // [a,b,c,d]
        } // edgepivot == 2
        // Insert the two recovered tets into Star(ab).
        abtets[((t-1) + (i+1)) % (i+1)] = fliptets[0];
        abtets[t] = fliptets[1];
      } 
      else {
        // Only free the spaces.
        flipnm_post(tmpabtets, n1, 2, edgepivot, fc);
      } // if (!unflip)
      if (b->verbose > 2) {
        printf("      Release %d spaces at f[%d].\n", n1, i);
      }
      delete [] tmpabtets;
    }
  } // i

  return 1;
}